

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O2

list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_> * __thiscall
duckdb::BoxRenderer::PivotCollections
          (list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
           *__return_storage_ptr__,BoxRenderer *this,ClientContext *context,
          list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_> *input,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *column_names,vector<duckdb::LogicalType,_true> *result_types,idx_t row_count)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  idx_t index;
  bool bVar4;
  Allocator *allocator;
  long lVar5;
  reference pvVar6;
  reference type;
  DataChunk *this_00;
  unsigned_long __val;
  ColumnDataCollection *__n;
  ulong index_00;
  ColumnDataCollection *this_01;
  idx_t r;
  _List_node_base *p_Var7;
  idx_t iVar8;
  initializer_list<unsigned_long> __l;
  list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_> *local_350;
  vector<duckdb::LogicalType,_true> varchar_types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  new_names;
  DataChunk row_chunk;
  vector<unsigned_long,_true> column_ids;
  ColumnDataChunkIterator __begin3;
  ColumnDataChunkIterationHelper local_1e0;
  string local_1c0;
  string local_1a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_180 [24];
  ColumnDataAppendState append_state;
  ColumnDataChunkIterator __end3;
  Value local_70;
  
  p_Var1 = (input->
           super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  p_Var2 = (input->
           super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
  varchar_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  varchar_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  varchar_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  new_names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  new_names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  new_names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[7]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&new_names,
             (char (*) [7])0x107dc8d);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[5]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&new_names,
             (char (*) [5])0x11595ba);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&varchar_types,
             &LogicalType::VARCHAR);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&varchar_types,
             &LogicalType::VARCHAR);
  for (__val = 1; (_List_node_base *)(__val - 1) < p_Var1[3]._M_prev; __val = __val + 1) {
    ::std::__cxx11::to_string((string *)&__end3,__val);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin3,
                     "Row ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &__end3);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&new_names,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin3);
    ::std::__cxx11::string::~string((string *)&__begin3);
    ::std::__cxx11::string::~string((string *)&__end3);
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalTypeId_const&>
              ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&varchar_types,
               &LogicalType::VARCHAR);
  }
  for (p_Var7 = (_List_node_base *)0x0; p_Var3 = p_Var2[3]._M_prev, p_Var7 < p_Var3;
      p_Var7 = (_List_node_base *)((long)&p_Var7->_M_next + 1)) {
    ::std::__cxx11::to_string((string *)&__end3,(long)p_Var7 + ((row_count + 1) - (long)p_Var3));
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin3,
                     "Row ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &__end3);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&new_names,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin3);
    ::std::__cxx11::string::~string((string *)&__begin3);
    ::std::__cxx11::string::~string((string *)&__end3);
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalTypeId_const&>
              ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&varchar_types,
               &LogicalType::VARCHAR);
  }
  DataChunk::DataChunk(&row_chunk);
  allocator = Allocator::DefaultAllocator();
  DataChunk::Initialize(&row_chunk,allocator,&varchar_types,0x800);
  (__return_storage_ptr__->
  super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>).
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>).
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>).
  _M_impl._M_node._M_size = 0;
  ::std::__cxx11::list<duckdb::ColumnDataCollection,std::allocator<duckdb::ColumnDataCollection>>::
  emplace_back<duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&>
            ((list<duckdb::ColumnDataCollection,std::allocator<duckdb::ColumnDataCollection>> *)
             __return_storage_ptr__,context,&varchar_types);
  ::std::__cxx11::list<duckdb::ColumnDataCollection,std::allocator<duckdb::ColumnDataCollection>>::
  emplace_back<duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&>
            ((list<duckdb::ColumnDataCollection,std::allocator<duckdb::ColumnDataCollection>> *)
             __return_storage_ptr__,context,&varchar_types);
  this_01 = (ColumnDataCollection *)
            ((__return_storage_ptr__->
             super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
             )._M_impl._M_node.super__List_node_base._M_next + 1);
  append_state.current_chunk_state.handles._M_h._M_buckets =
       &append_state.current_chunk_state.handles._M_h._M_single_bucket;
  append_state.current_chunk_state.handles._M_h._M_bucket_count = 1;
  append_state.current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  append_state.current_chunk_state.handles._M_h._M_element_count = 0;
  append_state.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  append_state.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  append_state.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  append_state.current_chunk_state.properties = INVALID;
  append_state.vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  append_state.vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  append_state.vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ColumnDataCollection::InitializeAppend(this_01,&append_state);
  __n = (ColumnDataCollection *)0x0;
  do {
    lVar5 = (long)p_Var1[2]._M_prev - (long)p_Var1[2]._M_next;
    if ((ColumnDataCollection *)(lVar5 / 0x18) <= __n) {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)column_names,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&new_names,lVar5 % 0x18);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
                (&result_types->
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &varchar_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      ColumnDataAppendState::~ColumnDataAppendState(&append_state);
      DataChunk::~DataChunk(&row_chunk);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&new_names);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                (&varchar_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      return __return_storage_ptr__;
    }
    __l._M_len = 1;
    __l._M_array = (iterator)&__begin3;
    __begin3.collection = __n;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&column_ids,__l,
               (allocator_type *)&__end3);
    index = row_chunk.count;
    pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(column_names,(size_type)__n);
    ::std::__cxx11::string::string((string *)&local_1a0,(string *)pvVar6);
    Value::Value((Value *)&__begin3,&local_1a0);
    DataChunk::SetValue(&row_chunk,0,index,(Value *)&__begin3);
    Value::~Value((Value *)&__begin3);
    ::std::__cxx11::string::~string((string *)&local_1a0);
    type = vector<duckdb::LogicalType,_true>::get<true>(result_types,(size_type)__n);
    RenderType_abi_cxx11_(&local_1c0,this,type);
    Value::Value((Value *)&__begin3,&local_1c0);
    DataChunk::SetValue(&row_chunk,1,index,(Value *)&__begin3);
    Value::~Value((Value *)&__begin3);
    ::std::__cxx11::string::~string((string *)&local_1c0);
    iVar8 = 2;
    local_350 = input;
    while (local_350 = (list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
                        *)(local_350->
                          super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
                          )._M_impl._M_node.super__List_node_base._M_next, local_350 != input) {
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (local_180,&column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
      ColumnDataCollection::Chunks
                (&local_1e0,(ColumnDataCollection *)((long)local_350 + 0x10),
                 (vector<unsigned_long,_true> *)local_180);
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_180);
      ColumnDataChunkIterationHelper::begin(&__begin3,&local_1e0);
      ColumnDataChunkIterationHelper::end(&__end3,&local_1e0);
      while( true ) {
        bVar4 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                          (&__begin3,&__end3);
        if (!bVar4) break;
        this_00 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(&__begin3);
        for (index_00 = 0; index_00 < this_00->count; index_00 = index_00 + 1) {
          DataChunk::GetValue(&local_70,this_00,0,index_00);
          DataChunk::SetValue(&row_chunk,iVar8 + index_00,index,&local_70);
          Value::~Value(&local_70);
        }
        ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(&__begin3);
        iVar8 = iVar8 + index_00;
      }
      ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&__end3);
      ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&__begin3);
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &local_1e0.column_ids);
    }
    row_chunk.count = row_chunk.count + 1;
    if (row_chunk.count == 0x800) {
LAB_0031d01a:
      ColumnDataCollection::Append(this_01,&append_state,&row_chunk);
      DataChunk::Reset(&row_chunk);
    }
    else if ((undefined1 *)
             ((long)&(__n->allocator).internal.
                     super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr + 1) ==
             (undefined1 *)(((long)p_Var1[2]._M_prev - (long)p_Var1[2]._M_next) / 0x18))
    goto LAB_0031d01a;
    __n = (ColumnDataCollection *)
          ((long)&(__n->allocator).internal.
                  super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          + 1);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&column_ids);
  } while( true );
}

Assistant:

list<ColumnDataCollection> BoxRenderer::PivotCollections(ClientContext &context, list<ColumnDataCollection> input,
                                                         vector<string> &column_names,
                                                         vector<LogicalType> &result_types, idx_t row_count) {
	auto &top = input.front();
	auto &bottom = input.back();

	vector<LogicalType> varchar_types;
	vector<string> new_names;
	new_names.emplace_back("Column");
	new_names.emplace_back("Type");
	varchar_types.emplace_back(LogicalType::VARCHAR);
	varchar_types.emplace_back(LogicalType::VARCHAR);
	for (idx_t r = 0; r < top.Count(); r++) {
		new_names.emplace_back("Row " + to_string(r + 1));
		varchar_types.emplace_back(LogicalType::VARCHAR);
	}
	for (idx_t r = 0; r < bottom.Count(); r++) {
		auto row_index = row_count - bottom.Count() + r + 1;
		new_names.emplace_back("Row " + to_string(row_index));
		varchar_types.emplace_back(LogicalType::VARCHAR);
	}
	//
	DataChunk row_chunk;
	row_chunk.Initialize(Allocator::DefaultAllocator(), varchar_types);
	std::list<ColumnDataCollection> result;
	result.emplace_back(context, varchar_types);
	result.emplace_back(context, varchar_types);
	auto &res_coll = result.front();
	ColumnDataAppendState append_state;
	res_coll.InitializeAppend(append_state);
	for (idx_t c = 0; c < top.ColumnCount(); c++) {
		vector<column_t> column_ids {c};
		auto row_index = row_chunk.size();
		idx_t current_index = 0;
		row_chunk.SetValue(current_index++, row_index, column_names[c]);
		row_chunk.SetValue(current_index++, row_index, RenderType(result_types[c]));
		for (auto &collection : input) {
			for (auto &chunk : collection.Chunks(column_ids)) {
				for (idx_t r = 0; r < chunk.size(); r++) {
					row_chunk.SetValue(current_index++, row_index, chunk.GetValue(0, r));
				}
			}
		}
		row_chunk.SetCardinality(row_chunk.size() + 1);
		if (row_chunk.size() == STANDARD_VECTOR_SIZE || c + 1 == top.ColumnCount()) {
			res_coll.Append(append_state, row_chunk);
			row_chunk.Reset();
		}
	}
	column_names = std::move(new_names);
	result_types = std::move(varchar_types);
	return result;
}